

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int Curl_ossl_shutdown(connectdata *conn,int sockindex)

{
  Curl_easy *pCVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  ulong e;
  char *pcVar5;
  char buf [256];
  char acStack_138 [264];
  
  pcVar5 = acStack_138;
  pCVar1 = conn->data;
  if ((pCVar1->set).ftp_ccc == CURLFTPSSL_CCC_ACTIVE) {
    SSL_shutdown((SSL *)(conn->ssl[sockindex].backend)->handle);
  }
  if ((conn->ssl[sockindex].backend)->handle == (SSL *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = Curl_socket_check(conn->sock[sockindex],-1,-1,10000);
    while (0 < iVar2) {
      ERR_clear_error();
      iVar2 = SSL_read((SSL *)(conn->ssl[sockindex].backend)->handle,acStack_138,0x100);
      uVar3 = SSL_get_error((SSL *)(conn->ssl[sockindex].backend)->handle,iVar2);
      if (uVar3 != 2) {
        if ((uVar3 == 0) || (uVar3 == 6)) {
          iVar2 = 0;
        }
        else if (uVar3 == 3) {
          iVar2 = 0;
          Curl_infof(pCVar1,"SSL_ERROR_WANT_WRITE\n");
        }
        else {
          e = ERR_get_error();
          pCVar1 = conn->data;
          if (e == 0) {
            if (uVar3 < 0xb) {
              pcVar5 = (&PTR_anon_var_dwarf_10cd64_00165c58)[uVar3];
            }
            else {
              pcVar5 = "SSL_ERROR unknown";
            }
          }
          else {
            ERR_error_string_n(e,acStack_138,0x100);
          }
          puVar4 = (uint *)__errno_location();
          iVar2 = 0;
          Curl_failf(pCVar1,"OpenSSL SSL_read on shutdown: %s, errno %d",pcVar5,(ulong)*puVar4);
        }
        goto LAB_00146d08;
      }
      Curl_infof(pCVar1,"SSL_ERROR_WANT_READ\n");
      iVar2 = Curl_socket_check(conn->sock[sockindex],-1,-1,10000);
    }
    if (iVar2 == 0) {
      iVar2 = 0;
      Curl_failf(pCVar1,"SSL shutdown timeout");
    }
    else {
      puVar4 = (uint *)__errno_location();
      Curl_failf(pCVar1,"select/poll on SSL socket, errno: %d",(ulong)*puVar4);
      iVar2 = -1;
    }
LAB_00146d08:
    SSL_free((SSL *)(conn->ssl[sockindex].backend)->handle);
    (conn->ssl[sockindex].backend)->handle = (SSL *)0x0;
  }
  return iVar2;
}

Assistant:

static int Curl_ossl_shutdown(struct connectdata *conn, int sockindex)
{
  int retval = 0;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  struct Curl_easy *data = conn->data;
  char buf[256]; /* We will use this for the OpenSSL error buffer, so it has
                    to be at least 256 bytes long. */
  unsigned long sslerror;
  ssize_t nread;
  int buffsize;
  int err;
  bool done = FALSE;

#ifndef CURL_DISABLE_FTP
  /* This has only been tested on the proftpd server, and the mod_tls code
     sends a close notify alert without waiting for a close notify alert in
     response. Thus we wait for a close notify alert from the server, but
     we do not send one. Let's hope other servers do the same... */

  if(data->set.ftp_ccc == CURLFTPSSL_CCC_ACTIVE)
      (void)SSL_shutdown(BACKEND->handle);
#endif

  if(BACKEND->handle) {
    buffsize = (int)sizeof(buf);
    while(!done) {
      int what = SOCKET_READABLE(conn->sock[sockindex],
                                 SSL_SHUTDOWN_TIMEOUT);
      if(what > 0) {
        ERR_clear_error();

        /* Something to read, let's do it and hope that it is the close
           notify alert from the server */
        nread = (ssize_t)SSL_read(BACKEND->handle, buf, buffsize);
        err = SSL_get_error(BACKEND->handle, (int)nread);

        switch(err) {
        case SSL_ERROR_NONE: /* this is not an error */
        case SSL_ERROR_ZERO_RETURN: /* no more data */
          /* This is the expected response. There was no data but only
             the close notify alert */
          done = TRUE;
          break;
        case SSL_ERROR_WANT_READ:
          /* there's data pending, re-invoke SSL_read() */
          infof(data, "SSL_ERROR_WANT_READ\n");
          break;
        case SSL_ERROR_WANT_WRITE:
          /* SSL wants a write. Really odd. Let's bail out. */
          infof(data, "SSL_ERROR_WANT_WRITE\n");
          done = TRUE;
          break;
        default:
          /* openssl/ssl.h says "look at error stack/return value/errno" */
          sslerror = ERR_get_error();
          failf(conn->data, OSSL_PACKAGE " SSL_read on shutdown: %s, errno %d",
                (sslerror ?
                 ossl_strerror(sslerror, buf, sizeof(buf)) :
                 SSL_ERROR_to_str(err)),
                SOCKERRNO);
          done = TRUE;
          break;
        }
      }
      else if(0 == what) {
        /* timeout */
        failf(data, "SSL shutdown timeout");
        done = TRUE;
      }
      else {
        /* anything that gets here is fatally bad */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        retval = -1;
        done = TRUE;
      }
    } /* while()-loop for the select() */

    if(data->set.verbose) {
#ifdef HAVE_SSL_GET_SHUTDOWN
      switch(SSL_get_shutdown(BACKEND->handle)) {
      case SSL_SENT_SHUTDOWN:
        infof(data, "SSL_get_shutdown() returned SSL_SENT_SHUTDOWN\n");
        break;
      case SSL_RECEIVED_SHUTDOWN:
        infof(data, "SSL_get_shutdown() returned SSL_RECEIVED_SHUTDOWN\n");
        break;
      case SSL_SENT_SHUTDOWN|SSL_RECEIVED_SHUTDOWN:
        infof(data, "SSL_get_shutdown() returned SSL_SENT_SHUTDOWN|"
              "SSL_RECEIVED__SHUTDOWN\n");
        break;
      }
#endif
    }

    SSL_free(BACKEND->handle);
    BACKEND->handle = NULL;
  }
  return retval;
}